

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FloatValue::MergeFrom(FloatValue *this,FloatValue *from)

{
  float fVar1;
  void *pvVar2;
  LogMessage *other;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/wrappers.pb.cc"
               ,0x28f);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  pvVar2 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,
               (UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8));
  }
  fVar1 = from->value_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->value_ = fVar1;
  }
  return;
}

Assistant:

void FloatValue::MergeFrom(const FloatValue& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FloatValue)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (!(from.value() <= 0 && from.value() >= 0)) {
    _internal_set_value(from._internal_value());
  }
}